

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::AreaIsAccumulatedFromCellsAtTheSamePosition(RendererTests *this)

{
  bypass_alpha *this_00;
  int area_00;
  uint uVar1;
  int length;
  cell *pcVar2;
  bool bVar3;
  allocator local_131;
  string local_130 [32];
  LocationInfo local_110;
  undefined1 auStack_e8 [8];
  span reference [2];
  undefined1 auStack_b8 [8];
  cell cells [5];
  scanline_mockup sl;
  RendererTests *this_local;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  
  sl._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)&cells[4].cover,true);
  cells[3].area = 0x777;
  cells[3].cover = -0x200;
  cells[4].x = 0;
  cells[2].x = 0;
  cells[2].area = 0x777;
  cells[2].cover = 0x2600;
  cells[3].x = 0;
  cells[0].cover = 0x8e00;
  cells[1].x = 0;
  cells[1].area = 0x777;
  cells[1].cover = 0x18e00;
  auStack_b8._0_4_ = 7;
  auStack_b8._4_4_ = 0x10200;
  cells[0].x = 0;
  cells[0].area = 7;
  _area = begin<agge::tests::mocks::cell,5ul>((cell (*) [5])auStack_b8);
  pcVar2 = end<agge::tests::mocks::cell,5ul>((cell (*) [5])auStack_b8);
  this_00 = (bypass_alpha *)((long)&reference[1].length + 3);
  i._4_4_ = 0;
  if (_area != pcVar2) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar3 = false;
        if (_area != pcVar2) {
          bVar3 = _area->x == cover_m;
        }
      } while (bVar3);
      area_00 = i._4_4_ * 0x200;
      if (len != 0) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)&cells[4].cover,cover_m,uVar1);
        cover_m = cover_m + 1;
      }
      if (_area == pcVar2) break;
      length = _area->x - cover_m;
      if ((length != 0) && (area_00 != 0)) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00);
        anon_unknown_1::scanline_mockup::add_span
                  ((scanline_mockup *)&cells[4].cover,cover_m,length,uVar1);
      }
    }
  }
  reference[0].length = 0x7fffffff;
  reference[0].cover = 0x777;
  reference[1].y = 0;
  reference[1].x = -0x1b200;
  auStack_e8._0_4_ = 0x7fffffff;
  auStack_e8._4_4_ = 7;
  reference[0].y = 0;
  reference[0].x = -0x19000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_131);
  ut::LocationInfo::LocationInfo(&local_110,(string *)local_130,0x97);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [2])auStack_e8,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl,&local_110);
  ut::LocationInfo::~LocationInfo(&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)&cells[4].cover);
  return;
}

Assistant:

test( AreaIsAccumulatedFromCellsAtTheSamePosition )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = {
					{ 7, 129 * 512, 0 }, { 7, 71 * 512, 0 },
					{ 1911, 199 * 512, 0 }, { 1911, 19 * 512, 0 }, { 1911, -1 * 512, 0 },
				};

				// ACT
				sweep_scanline<8>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference[] = {
					{ 0x7fffffff, 7, 0, -200 * 512 },
					{ 0x7fffffff, 1911, 0, -217 * 512 },
				};

				assert_equal(reference, sl.spans_log);
			}